

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calculateEdgeLogLikelihoodsByPartition
          (BeagleCPUImpl<float,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *firstDerivativeIndices,int *secondDerivativeIndices,
          int *categoryWeightsIndices,int *stateFrequenciesIndices,int *cumulativeScaleIndices,
          int *partitionIndices,int partitionCount,int count,double *outSumLogLikelihoodByPartition,
          double *outSumLogLikelihood,double *outSumFirstDerivativeByPartition,
          double *outSumFirstDerivative,double *outSumSecondDerivativeByPartition,
          double *outSumSecondDerivative)

{
  double dVar1;
  _func_int **pp_Var2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = -7;
  if ((count == 1) && ((this->kFlags & 0x180) == 0)) {
    if (firstDerivativeIndices == (int *)0x0 && secondDerivativeIndices == (int *)0x0) {
      pp_Var2 = (this->super_BeagleImpl)._vptr_BeagleImpl;
      if (this->kThreadingEnabled == true) {
        (*pp_Var2[0x4d])();
      }
      else {
        (*pp_Var2[0x4f])();
      }
      iVar3 = 0;
    }
    else {
      if (secondDerivativeIndices == (int *)0x0) {
        return -7;
      }
      (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x50])();
      *outSumFirstDerivative = 0.0;
      *outSumSecondDerivative = 0.0;
      if (0 < partitionCount) {
        uVar4 = 0;
        do {
          *outSumFirstDerivative = outSumFirstDerivativeByPartition[uVar4] + *outSumFirstDerivative;
          *outSumSecondDerivative =
               outSumSecondDerivativeByPartition[uVar4] + *outSumSecondDerivative;
          uVar4 = uVar4 + 1;
        } while ((uint)partitionCount != uVar4);
      }
      if ((NAN(*outSumFirstDerivative)) || (iVar3 = 0, NAN(*outSumSecondDerivative))) {
        iVar3 = -8;
      }
    }
    *outSumLogLikelihood = 0.0;
    if (0 < partitionCount) {
      dVar1 = *outSumLogLikelihood;
      uVar4 = 0;
      do {
        dVar1 = dVar1 + outSumLogLikelihoodByPartition[uVar4];
        *outSumLogLikelihood = dVar1;
        uVar4 = uVar4 + 1;
      } while ((uint)partitionCount != uVar4);
    }
    if (NAN(*outSumLogLikelihood)) {
      iVar3 = -8;
    }
  }
  return iVar3;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calculateEdgeLogLikelihoodsByPartition(
                                                    const int* parentBufferIndices,
                                                    const int* childBufferIndices,
                                                    const int* probabilityIndices,
                                                    const int* firstDerivativeIndices,
                                                    const int* secondDerivativeIndices,
                                                    const int* categoryWeightsIndices,
                                                    const int* stateFrequenciesIndices,
                                                    const int* cumulativeScaleIndices,
                                                    const int* partitionIndices,
                                                    int partitionCount,
                                                    int count,
                                                    double* outSumLogLikelihoodByPartition,
                                                    double* outSumLogLikelihood,
                                                    double* outSumFirstDerivativeByPartition,
                                                    double* outSumFirstDerivative,
                                                    double* outSumSecondDerivativeByPartition,
                                                    double* outSumSecondDerivative) {

    int returnCode = BEAGLE_SUCCESS;

    if (count == 1) {
        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            returnCode =  BEAGLE_ERROR_NO_IMPLEMENTATION;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            returnCode = BEAGLE_ERROR_NO_IMPLEMENTATION;
        } else {

            if (firstDerivativeIndices == NULL && secondDerivativeIndices == NULL) {

                if (kThreadingEnabled) {
                    calcEdgeLogLikelihoodsByPartitionAsync(parentBufferIndices,
                                                           childBufferIndices,
                                                           probabilityIndices,
                                                           categoryWeightsIndices,
                                                           stateFrequenciesIndices,
                                                           cumulativeScaleIndices,
                                                           partitionIndices,
                                                           partitionCount,
                                                           outSumLogLikelihoodByPartition);
                } else {
                    calcEdgeLogLikelihoodsByPartition(parentBufferIndices,
                                                      childBufferIndices,
                                                      probabilityIndices,
                                                      categoryWeightsIndices,
                                                      stateFrequenciesIndices,
                                                      cumulativeScaleIndices,
                                                      partitionIndices,
                                                      partitionCount,
                                                      outSumLogLikelihoodByPartition);
                }


            } else if (secondDerivativeIndices == NULL) {
                return BEAGLE_ERROR_NO_IMPLEMENTATION;
            } else {

                calcEdgeLogLikelihoodsSecondDerivByPartition(
                                                parentBufferIndices,
                                                childBufferIndices,
                                                probabilityIndices,
                                                firstDerivativeIndices,
                                                secondDerivativeIndices,
                                                categoryWeightsIndices,
                                                stateFrequenciesIndices,
                                                cumulativeScaleIndices,
                                                partitionIndices,
                                                partitionCount,
                                                outSumLogLikelihoodByPartition,
                                                outSumFirstDerivativeByPartition,
                                                outSumSecondDerivativeByPartition);

                *outSumFirstDerivative  = 0.0;
                *outSumSecondDerivative = 0.0;

                for (int i = 0; i < partitionCount; i++) {
                    *outSumFirstDerivative  += outSumFirstDerivativeByPartition[i];
                    *outSumSecondDerivative += outSumSecondDerivativeByPartition[i];
                }

                if (*outSumFirstDerivative  != *outSumFirstDerivative ||
                    *outSumSecondDerivative != *outSumSecondDerivative) {
                    returnCode = BEAGLE_ERROR_FLOATING_POINT;
                }
            }

            *outSumLogLikelihood = 0.0;

            for (int i = 0; i < partitionCount; i++) {
                *outSumLogLikelihood += outSumLogLikelihoodByPartition[i];
            }

            if (*outSumLogLikelihood != *outSumLogLikelihood) {
                returnCode = BEAGLE_ERROR_FLOATING_POINT;
            }

        }
    } else {
        returnCode = BEAGLE_ERROR_NO_IMPLEMENTATION;
    }

    return returnCode;
}